

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

qsizetype stringWidth(QStringView text)

{
  long lVar1;
  QStringView string;
  bool bVar2;
  storage_type_conflict *in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  char32_t ch;
  qsizetype count;
  QStringIterator counter;
  undefined4 in_stack_ffffffffffffffb0;
  char32_t in_stack_ffffffffffffffb4;
  QStringIterator *in_stack_ffffffffffffffb8;
  QStringIterator *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  string.m_data = in_RSI;
  string.m_size = in_RDI;
  QStringIterator::QStringIterator
            (in_stack_ffffffffffffffb8,string,
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  this = (QStringIterator *)0x0;
  while( true ) {
    bVar2 = QStringIterator::hasNext((QStringIterator *)0x4cd1af);
    if (!bVar2) break;
    this = (QStringIterator *)((long)&this->i + 1);
    in_stack_ffffffffffffffb4 = QStringIterator::next(this,in_stack_ffffffffffffffb4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (qsizetype)this;
  }
  __stack_chk_fail();
}

Assistant:

static qsizetype stringWidth(QStringView text)
{
    QStringIterator counter(text);
    qsizetype count = 0;
    while (counter.hasNext()) {
        ++count;
        [[maybe_unused]] auto ch = counter.next();
    }
    return count;
}